

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

Expression *
slang::ast::CallExpression::fromSystemMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *syntax,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  string_view name;
  SystemSubroutine *pSVar1;
  long in_RCX;
  Diagnostic *diag;
  SystemSubroutine *subroutine;
  Type *type;
  ASTContext *in_stack_000006f8;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_00000700;
  InvocationExpressionSyntax *in_stack_00000708;
  Expression *in_stack_00000710;
  SystemSubroutine *in_stack_00000718;
  Compilation *in_stack_00000720;
  SourceRange in_stack_00000870;
  Scope *in_stack_00000880;
  Expression *in_stack_fffffffffffffee8;
  Compilation *in_stack_fffffffffffffef0;
  SourceLocation in_stack_fffffffffffffef8;
  SourceLocation in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  DiagCode in_stack_ffffffffffffff14;
  SourceLocation in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  DiagCode code;
  Diagnostic *in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff50;
  SymbolKind typeKind;
  Compilation *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Expression *local_8;
  
  typeKind = (SymbolKind)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  code = SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0);
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9d7098);
  Type::getCanonicalType((Type *)in_stack_fffffffffffffef0);
  name._M_str = in_stack_ffffffffffffff68;
  name._M_len = in_stack_ffffffffffffff60;
  pSVar1 = Compilation::getSystemMethod(in_stack_ffffffffffffff58,typeKind,name);
  if (pSVar1 == (SystemSubroutine *)0x0) {
    if (in_RCX == 0) {
      ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff00,in_stack_ffffffffffffff14,
                          in_stack_ffffffffffffff08);
      range.endLoc = in_stack_ffffffffffffff00;
      range.startLoc = in_stack_fffffffffffffef8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffef0,range);
      range_00.endLoc = in_stack_ffffffffffffff00;
      range_00.startLoc = in_stack_fffffffffffffef8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffef0,range_00);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9d7289);
      ast::operator<<((Diagnostic *)in_stack_ffffffffffffff38._M_str,
                      (Type *)in_stack_ffffffffffffff38._M_len);
    }
    else {
      sourceRange.startLoc._4_2_ = in_stack_ffffffffffffff14.subsystem;
      sourceRange.startLoc._6_2_ = in_stack_ffffffffffffff14.code;
      sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff10;
      sourceRange.endLoc = in_stack_ffffffffffffff18;
      ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff08,code,sourceRange);
      Diagnostic::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9d71b2);
      ast::operator<<((Diagnostic *)in_stack_ffffffffffffff38._M_str,
                      (Type *)in_stack_ffffffffffffff38._M_len);
    }
    local_8 = Expression::badExpr(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    if (in_RCX != 0) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff38._M_str);
    }
    local_8 = createSystemCall(in_stack_00000720,in_stack_00000718,in_stack_00000710,
                               in_stack_00000708,in_stack_00000700,in_stack_00000870,
                               in_stack_000006f8,in_stack_00000880);
  }
  return local_8;
}

Assistant:

Expression& CallExpression::fromSystemMethod(
    Compilation& compilation, const Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    const Type& type = expr.type->getCanonicalType();
    auto subroutine = compilation.getSystemMethod(type.kind, selector.name);
    if (!subroutine) {
        if (syntax) {
            context.addDiag(diag::UnknownSystemMethod, selector.nameRange)
                << selector.name << *expr.type;
        }
        else {
            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
        }
        return badExpr(compilation, &expr);
    }

    return createSystemCall(compilation, *subroutine, &expr, syntax, withClause,
                            syntax ? syntax->sourceRange() : expr.sourceRange, context);
}